

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_vbi_decode(void *buf,uint64_t *value,size_t len)

{
  byte bVar1;
  ulong uVar2;
  uint8_t *p;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  uVar2 = 0;
  uVar4 = 0;
  while( true ) {
    if ((byte *)(len + (long)buf) <= (byte *)((long)buf + lVar3)) {
      return 0;
    }
    bVar1 = *(byte *)((long)buf + lVar3);
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)uVar2 & 0x3f);
    if ((char)bVar1 < '\0') break;
    if (0x38 < uVar2) {
      return 0;
    }
    uVar2 = uVar2 + 7;
    lVar3 = lVar3 + 1;
  }
  *value = uVar4;
  return (int)lVar3;
}

Assistant:

int
lws_vbi_decode(const void *buf, uint64_t *value, size_t len)
{
	const uint8_t *p = (const uint8_t *)buf, *end = p + len;
	uint64_t v = 0;
	int s = 0;

	while (p < end) {
		v |= (((uint64_t)(*p)) & 0x7f) << s;
		if (*p & 0x80) {
			*value = v;

			return lws_ptr_diff(p, buf);
		}
		s += 7;
		if (s >= 64)
			return 0;
		p++;
	}

	return 0;
}